

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerException.cpp
# Opt level: O1

string * ninx::lexer::exception::LexerException::make_message
                   (string *__return_storage_ptr__,int line,string *origin,string *message)

{
  ostream *poVar1;
  stringstream s;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"LexerError at line: ",0x14);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tfrom origin: ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(origin->_M_dataplus)._M_p,origin->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string
ninx::lexer::exception::LexerException::make_message(int line, const std::string &origin, const std::string &message) {
    std::stringstream s;
    s << "LexerError at line: " << line << ", " << message << std::endl;
    s << "\tfrom origin: " << origin;
    return s.str();
}